

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

void __thiscall OPL::DOSBox::DBOPL::Operator::UpdateAttenuation(Operator *this)

{
  this->totalLevel =
       (uint)(*(byte *)((long)&this->chanData + 2) >>
             (*(byte *)((long)&KslShiftTable + (ulong)(this->reg40 >> 6)) & 0x1f)) +
       (this->reg40 & 0x3f) * 4;
  return;
}

Assistant:

inline void Operator::UpdateAttenuation( ) {
	Bit8u kslBase = (Bit8u)((chanData >> SHIFT_KSLBASE) & 0xff);
	Bit32u tl = reg40 & 0x3f;
	Bit8u kslShift = KslShiftTable[ reg40 >> 6 ];
	//Make sure the attenuation goes to the right bits
	totalLevel = tl << ( ENV_BITS - 7 );	//Total level goes 2 bits below max
	totalLevel += ( kslBase << ENV_EXTRA ) >> kslShift;
}